

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress4X_usingDTable_bmi2
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2
                 )

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  long lVar8;
  sbyte sVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  size_t sVar13;
  byte bVar14;
  ulong *puVar15;
  int iVar16;
  int iVar17;
  byte *srcBuffer;
  int iVar18;
  ulong uVar19;
  undefined1 *puVar20;
  int iVar21;
  ulong *puVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  undefined1 *puVar26;
  ulong uVar27;
  ulong uVar28;
  HUF_DTable *pHVar29;
  ulong *puVar30;
  undefined1 *puVar31;
  bool bVar32;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  ulong uStack_128;
  ulong uStack_120;
  ulong *puStack_118;
  undefined1 *puStack_110;
  ulong *puStack_100;
  ulong uStack_f8;
  uint uStack_ec;
  ulong *puStack_e0;
  size_t sStack_d8;
  size_t *psStack_c0;
  BIT_DStream_t BStack_b0;
  undefined1 *puStack_88;
  undefined1 *puStack_80;
  ulong *puStack_78;
  size_t sStack_70;
  void *pvStack_68;
  HUF_DTable *pHStack_60;
  undefined1 *puStack_58;
  ulong *puStack_50;
  ulong *puStack_48;
  size_t *psStack_40;
  ulong uStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar13 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,bmi2);
    return sVar13;
  }
  if (bmi2 != 0) {
    sVar13 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
    return sVar13;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar4 = *cSrc;
  uVar19 = (ulong)uVar4;
  uVar5 = *(ushort *)((long)cSrc + 2);
  uVar6 = *(ushort *)((long)cSrc + 4);
  uVar12 = uVar19 + uVar5 + (ulong)uVar6 + 6;
  if (cSrcSize < uVar12) {
    return 0xffffffffffffffec;
  }
  if (uVar4 == 0) {
    return 0xffffffffffffffb8;
  }
  puStack_78 = (ulong *)((long)cSrc + 6);
  puVar30 = (ulong *)((long)cSrc + uVar19 + 6);
  uVar7 = *(ushort *)((long)DTable + 2);
  if (uVar4 < 8) {
    uStack_f8 = (ulong)*(byte *)puStack_78;
    switch(uVar4) {
    case 7:
      uStack_f8 = uStack_f8 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
    case 6:
      uStack_f8 = uStack_f8 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
    case 5:
      uStack_f8 = uStack_f8 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
    case 4:
      uStack_f8 = uStack_f8 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
    case 3:
      uStack_f8 = uStack_f8 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
    case 2:
      uStack_f8 = uStack_f8 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
    }
    bVar14 = *(byte *)((long)cSrc + uVar19 + 5);
    if (bVar14 == 0) {
      return 0xffffffffffffffec;
    }
    uVar11 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uStack_12c = (uVar11 ^ 0x1f) + (uint)uVar4 * -8 + 0x29;
    puStack_100 = puStack_78;
  }
  else {
    bVar14 = *(byte *)((long)cSrc + uVar19 + 5);
    if (bVar14 == 0) {
      return 0xffffffffffffffff;
    }
    uStack_f8 = *(ulong *)((long)cSrc + (uVar19 - 2));
    uVar11 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uStack_12c = ~uVar11 + 9;
    puStack_100 = (ulong *)((long)cSrc + (uVar19 - 2));
  }
  if (uVar5 == 0) {
    return 0xffffffffffffffb8;
  }
  puVar22 = (ulong *)((ulong)uVar5 + (long)puVar30);
  if (uVar5 < 8) {
    uStack_120 = (ulong)(byte)*puVar30;
    switch(uVar5) {
    case 2:
      goto LAB_001636c9;
    case 3:
      goto LAB_001636be;
    case 4:
      goto LAB_001636b3;
    case 5:
      goto LAB_001636a7;
    case 6:
      break;
    case 7:
      uStack_120 = uStack_120 | (ulong)*(byte *)((long)cSrc + uVar19 + 0xc) << 0x30;
      break;
    default:
      goto switchD_0016364c_default;
    }
    uStack_120 = uStack_120 + ((ulong)*(byte *)((long)cSrc + uVar19 + 0xb) << 0x28);
LAB_001636a7:
    uStack_120 = uStack_120 + ((ulong)*(byte *)((long)cSrc + uVar19 + 10) << 0x20);
LAB_001636b3:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + uVar19 + 9) * 0x1000000;
LAB_001636be:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + uVar19 + 8) * 0x10000;
LAB_001636c9:
    uStack_120 = uStack_120 + (ulong)*(byte *)((long)cSrc + uVar19 + 7) * 0x100;
switchD_0016364c_default:
    bVar14 = *(byte *)((long)puVar22 + -1);
    if (bVar14 == 0) {
      return 0xffffffffffffffec;
    }
    uVar11 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uStack_130 = (uVar11 ^ 0x1f) + (uint)uVar5 * -8 + 0x29;
    puStack_e0 = puVar30;
  }
  else {
    bVar14 = *(byte *)((long)puVar22 + -1);
    if (bVar14 == 0) {
      return 0xffffffffffffffff;
    }
    uStack_120 = puVar22[-1];
    uVar11 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uStack_130 = ~uVar11 + 9;
    puStack_e0 = puVar22 + -1;
  }
  if (uVar6 == 0) {
    return 0xffffffffffffffb8;
  }
  srcBuffer = (byte *)((ulong)uVar6 + (long)puVar22);
  if (uVar6 < 8) {
    uStack_128 = (ulong)(byte)*puVar22;
    switch(uVar6) {
    case 2:
      goto LAB_001637f5;
    case 3:
      goto LAB_001637ea;
    case 4:
      goto LAB_001637df;
    case 5:
      goto LAB_001637d3;
    case 6:
      break;
    case 7:
      uStack_128 = uStack_128 | (ulong)*(byte *)((long)puVar22 + 6) << 0x30;
      break;
    default:
      goto switchD_00163791_default;
    }
    uStack_128 = uStack_128 + ((ulong)*(byte *)((long)puVar22 + 5) << 0x28);
LAB_001637d3:
    uStack_128 = uStack_128 + ((ulong)*(byte *)((long)puVar22 + 4) << 0x20);
LAB_001637df:
    uStack_128 = uStack_128 + (ulong)*(byte *)((long)puVar22 + 3) * 0x1000000;
LAB_001637ea:
    uStack_128 = uStack_128 + (ulong)*(byte *)((long)puVar22 + 2) * 0x10000;
LAB_001637f5:
    uStack_128 = uStack_128 + (ulong)*(byte *)((long)puVar22 + 1) * 0x100;
switchD_00163791_default:
    bVar14 = srcBuffer[-1];
    if (bVar14 == 0) {
      return 0xffffffffffffffec;
    }
    uVar11 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uStack_134 = (uVar11 ^ 0x1f) + (uint)uVar6 * -8 + 0x29;
    puStack_118 = puVar22;
  }
  else {
    bVar14 = srcBuffer[-1];
    if (bVar14 == 0) {
      return 0xffffffffffffffff;
    }
    uStack_128 = *(ulong *)(srcBuffer + -8);
    uVar11 = 0x1f;
    if (bVar14 != 0) {
      for (; bVar14 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uStack_134 = ~uVar11 + 9;
    puStack_118 = (ulong *)(srcBuffer + -8);
  }
  sVar13 = BIT_initDStream(&BStack_b0,srcBuffer,cSrcSize - uVar12);
  if (0xffffffffffffff88 < sVar13) {
    return sVar13;
  }
  puStack_58 = (undefined1 *)((long)dst + (maxDstSize - 3));
  pHVar29 = DTable + 1;
  uVar12 = maxDstSize + 3 >> 2;
  puStack_88 = (undefined1 *)((long)dst + uVar12);
  puStack_80 = puStack_88 + uVar12;
  puVar1 = puStack_80 + uVar12;
  puStack_48 = (ulong *)((long)cSrc + uVar19 + 0xe);
  puStack_50 = puVar22 + 1;
  sStack_d8 = BStack_b0.bitContainer;
  cVar10 = (char)uVar7;
  puVar20 = puStack_80;
  puVar26 = puStack_88;
  puVar31 = (undefined1 *)dst;
  puStack_110 = puVar1;
  sStack_70 = maxDstSize;
  if (puVar1 < puStack_58) {
    pHStack_60 = pHVar29;
    if (cVar10 == '\0') goto LAB_001644cd;
    uVar11 = -(uint)uVar7 & 0x3f;
    uStack_38 = (ulong)uVar11;
    psStack_40 = (size_t *)BStack_b0.limitPtr;
    psStack_c0 = (size_t *)BStack_b0.ptr;
    uStack_ec = BStack_b0.bitsConsumed;
    lVar8 = uVar12 * 3;
    puVar20 = (undefined1 *)dst;
    do {
      puVar31 = puVar20;
      sVar9 = (sbyte)uVar11;
      uVar19 = (uStack_f8 << ((byte)uStack_12c & 0x3f)) >> sVar9;
      uVar23 = (uStack_120 << ((byte)uStack_130 & 0x3f)) >> sVar9;
      uVar25 = (uStack_128 << ((byte)uStack_134 & 0x3f)) >> sVar9;
      iVar16 = *(byte *)((long)DTable + uVar19 * 2 + 5) + uStack_12c;
      uVar27 = (sStack_d8 << ((byte)uStack_ec & 0x3f)) >> sVar9;
      uVar28 = (uStack_f8 << ((byte)iVar16 & 0x3f)) >> sVar9;
      *puVar31 = *(undefined1 *)((long)pHVar29 + uVar19 * 2);
      iVar18 = *(byte *)((long)DTable + uVar23 * 2 + 5) + uStack_130;
      puVar31[uVar12] = *(undefined1 *)((long)pHVar29 + uVar23 * 2);
      iVar21 = *(byte *)((long)DTable + uVar25 * 2 + 5) + uStack_134;
      puVar31[uVar12 * 2] = *(undefined1 *)((long)pHVar29 + uVar25 * 2);
      iVar24 = *(byte *)((long)DTable + uVar27 * 2 + 5) + uStack_ec;
      puVar31[lVar8] = *(undefined1 *)((long)pHVar29 + uVar27 * 2);
      uVar19 = (uStack_120 << ((byte)iVar18 & 0x3f)) >> sVar9;
      uVar25 = (uStack_128 << ((byte)iVar21 & 0x3f)) >> sVar9;
      iVar16 = (uint)*(byte *)((long)DTable + uVar28 * 2 + 5) + iVar16;
      uVar27 = (sStack_d8 << ((byte)iVar24 & 0x3f)) >> sVar9;
      uVar23 = (uStack_f8 << ((byte)iVar16 & 0x3f)) >> sVar9;
      puVar31[1] = *(undefined1 *)((long)pHVar29 + uVar28 * 2);
      iVar18 = (uint)*(byte *)((long)DTable + uVar19 * 2 + 5) + iVar18;
      puVar31[uVar12 + 1] = *(undefined1 *)((long)pHVar29 + uVar19 * 2);
      iVar21 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar21;
      puVar31[uVar12 * 2 + 1] = *(undefined1 *)((long)pHVar29 + uVar25 * 2);
      iVar24 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 5) + iVar24;
      puVar31[lVar8 + 1] = *(undefined1 *)((long)pHVar29 + uVar27 * 2);
      iVar16 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 5) + iVar16;
      puVar31[2] = *(undefined1 *)((long)pHVar29 + uVar23 * 2);
      uVar19 = (uStack_120 << ((byte)iVar18 & 0x3f)) >> sVar9;
      uVar23 = (uStack_128 << ((byte)iVar21 & 0x3f)) >> sVar9;
      iVar18 = (uint)*(byte *)((long)DTable + uVar19 * 2 + 5) + iVar18;
      uVar25 = (sStack_d8 << ((byte)iVar24 & 0x3f)) >> sVar9;
      uVar27 = (uStack_f8 << ((byte)iVar16 & 0x3f)) >> sVar9;
      puVar31[uVar12 + 2] = *(undefined1 *)((long)pHVar29 + uVar19 * 2);
      iVar21 = (uint)*(byte *)((long)DTable + uVar23 * 2 + 5) + iVar21;
      puVar31[uVar12 * 2 + 2] = *(undefined1 *)((long)pHVar29 + uVar23 * 2);
      iVar24 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar24;
      puVar31[lVar8 + 2] = *(undefined1 *)((long)pHVar29 + uVar25 * 2);
      uStack_12c = (uint)*(byte *)((long)DTable + uVar27 * 2 + 5) + iVar16;
      puVar31[3] = *(undefined1 *)((long)pHVar29 + uVar27 * 2);
      uVar19 = (uStack_120 << ((byte)iVar18 & 0x3f)) >> sVar9;
      bVar14 = *(byte *)((long)DTable + uVar19 * 2 + 5);
      puVar31[uVar12 + 3] = *(undefined1 *)((long)pHVar29 + uVar19 * 2);
      uVar19 = (uStack_128 << ((byte)iVar21 & 0x3f)) >> sVar9;
      bVar2 = *(byte *)((long)DTable + uVar19 * 2 + 5);
      puVar31[uVar12 * 2 + 3] = *(undefined1 *)((long)pHVar29 + uVar19 * 2);
      uVar19 = (sStack_d8 << ((byte)iVar24 & 0x3f)) >> sVar9;
      bVar3 = *(byte *)((long)DTable + uVar19 * 2 + 5);
      puVar31[lVar8 + 3] = *(undefined1 *)((long)pHVar29 + uVar19 * 2);
      iVar16 = 3;
      pvStack_68 = dst;
      if (puStack_100 < (ulong *)((long)cSrc + 0xe)) {
        iVar17 = 3;
      }
      else {
        if (0x40 < uStack_12c) goto LAB_001644ae;
        puStack_100 = (ulong *)((long)puStack_100 - (ulong)(uStack_12c >> 3));
        uStack_12c = uStack_12c & 7;
        uStack_f8 = *puStack_100;
        iVar17 = 0;
      }
      uStack_130 = iVar18 + (uint)bVar14;
      if (puStack_48 <= puStack_e0) {
        if (0x40 < uStack_130) goto LAB_001644ae;
        puStack_e0 = (ulong *)((long)puStack_e0 - (ulong)(uStack_130 >> 3));
        uStack_130 = uStack_130 & 7;
        uStack_120 = *puStack_e0;
        iVar16 = 0;
      }
      uStack_134 = iVar21 + (uint)bVar2;
      iVar21 = 3;
      if (puStack_118 < puStack_50) {
        iVar18 = 3;
      }
      else {
        if (0x40 < uStack_134) goto LAB_001644ae;
        puStack_118 = (ulong *)((long)puStack_118 - (ulong)(uStack_134 >> 3));
        uStack_134 = uStack_134 & 7;
        uStack_128 = *puStack_118;
        iVar18 = 0;
      }
      uStack_ec = iVar24 + (uint)bVar3;
      if (BStack_b0.limitPtr <= psStack_c0) {
        if (0x40 < uStack_ec) {
LAB_001644ae:
          __assert_fail("bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6a8,"BIT_DStream_status BIT_reloadDStreamFast(BIT_DStream_t *)");
        }
        psStack_c0 = (size_t *)((long)psStack_c0 - (ulong)(uStack_ec >> 3));
        uStack_ec = uStack_ec & 7;
        sStack_d8 = *psStack_c0;
        iVar21 = 0;
      }
    } while ((puVar31 + lVar8 + 4 < puStack_58) &&
            (puVar20 = puVar31 + 4, ((iVar16 == 0 && iVar17 == 0) && iVar18 == 0) && iVar21 == 0));
    puVar31 = puVar31 + 4;
    BStack_b0.bitsConsumed = uStack_ec;
    puVar20 = puVar31 + uVar12 * 2;
    puVar26 = puVar31 + uVar12;
    puStack_110 = puVar31 + lVar8;
    BStack_b0.ptr = (char *)psStack_c0;
  }
  BStack_b0.bitContainer = sStack_d8;
  if ((puStack_88 < puVar31) || (puStack_80 < puVar26)) {
    return 0xffffffffffffffec;
  }
  if (puVar1 < puVar20) {
    return 0xffffffffffffffec;
  }
  if (uStack_12c < 0x41) {
    bVar14 = -cVar10 & 0x3f;
    puVar15 = puStack_100;
    do {
      if (puVar15 < (ulong *)((long)cSrc + 0xe)) {
        puStack_100 = puStack_78;
        if (puVar15 == puStack_78) break;
        bVar32 = puStack_78 <= (ulong *)((long)puVar15 - (ulong)(uStack_12c >> 3));
        uVar11 = (int)puVar15 - (int)puStack_78;
        if (bVar32) {
          uVar11 = uStack_12c >> 3;
        }
        uStack_12c = uStack_12c + uVar11 * -8;
      }
      else {
        uVar11 = uStack_12c >> 3;
        uStack_12c = uStack_12c & 7;
        bVar32 = true;
      }
      puStack_100 = (ulong *)((long)puVar15 - (ulong)uVar11);
      uStack_f8 = *puStack_100;
      if ((puStack_88 + -3 <= puVar31) || (!bVar32)) break;
      if (cVar10 == '\0') goto LAB_001644cd;
      uVar12 = (uStack_f8 << ((byte)uStack_12c & 0x3f)) >> bVar14;
      iVar16 = *(byte *)((long)DTable + uVar12 * 2 + 5) + uStack_12c;
      *puVar31 = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      uVar12 = (uStack_f8 << ((byte)iVar16 & 0x3f)) >> bVar14;
      iVar16 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 5) + iVar16;
      uVar19 = (uStack_f8 << ((byte)iVar16 & 0x3f)) >> bVar14;
      puVar31[1] = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      iVar16 = (uint)*(byte *)((long)DTable + uVar19 * 2 + 5) + iVar16;
      uVar12 = (uStack_f8 << ((byte)iVar16 & 0x3f)) >> bVar14;
      puVar31[2] = *(undefined1 *)((long)pHVar29 + uVar19 * 2);
      uStack_12c = (uint)*(byte *)((long)DTable + uVar12 * 2 + 5) + iVar16;
      puVar31[3] = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      puVar31 = puVar31 + 4;
      puVar15 = puStack_100;
      if (0x40 < uStack_12c) break;
    } while( true );
  }
  if (puVar31 < puStack_88) {
    if (cVar10 == '\0') goto LAB_001644cd;
    do {
      uVar12 = (uStack_f8 << ((byte)uStack_12c & 0x3f)) >> (-cVar10 & 0x3fU);
      uStack_12c = *(byte *)((long)DTable + uVar12 * 2 + 5) + uStack_12c;
      *puVar31 = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      puVar31 = puVar31 + 1;
    } while (puVar31 < puStack_88);
  }
  puVar15 = puStack_e0;
  if (uStack_130 < 0x41) {
    bVar14 = -cVar10 & 0x3f;
    do {
      if (puStack_e0 < puStack_48) {
        puVar15 = puVar30;
        if (puStack_e0 == puVar30) break;
        bVar32 = puVar30 <= (ulong *)((long)puStack_e0 - (ulong)(uStack_130 >> 3));
        uVar11 = (int)puStack_e0 - (int)puVar30;
        if (bVar32) {
          uVar11 = uStack_130 >> 3;
        }
        uStack_130 = uStack_130 + uVar11 * -8;
      }
      else {
        uVar11 = uStack_130 >> 3;
        uStack_130 = uStack_130 & 7;
        bVar32 = true;
      }
      puStack_e0 = (ulong *)((long)puStack_e0 - (ulong)uVar11);
      uStack_120 = *puStack_e0;
      puVar15 = puStack_e0;
      if ((puStack_80 + -3 <= puVar26) || (!bVar32)) break;
      if (cVar10 == '\0') goto LAB_001644cd;
      uVar12 = (uStack_120 << ((byte)uStack_130 & 0x3f)) >> bVar14;
      iVar16 = *(byte *)((long)DTable + uVar12 * 2 + 5) + uStack_130;
      *puVar26 = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      uVar19 = (uStack_120 << ((byte)iVar16 & 0x3f)) >> bVar14;
      iVar16 = (uint)*(byte *)((long)DTable + uVar19 * 2 + 5) + iVar16;
      uVar12 = (uStack_120 << ((byte)iVar16 & 0x3f)) >> bVar14;
      puVar26[1] = *(undefined1 *)((long)pHVar29 + uVar19 * 2);
      iVar16 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 5) + iVar16;
      uVar19 = (uStack_120 << ((byte)iVar16 & 0x3f)) >> bVar14;
      puVar26[2] = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      uStack_130 = (uint)*(byte *)((long)DTable + uVar19 * 2 + 5) + iVar16;
      puVar26[3] = *(undefined1 *)((long)pHVar29 + uVar19 * 2);
      puVar26 = puVar26 + 4;
      if (0x40 < uStack_130) break;
    } while( true );
  }
  puStack_e0 = puVar15;
  if (puVar26 < puStack_80) {
    if (cVar10 == '\0') goto LAB_001644cd;
    do {
      uVar12 = (uStack_120 << ((byte)uStack_130 & 0x3f)) >> (-cVar10 & 0x3fU);
      uStack_130 = *(byte *)((long)DTable + uVar12 * 2 + 5) + uStack_130;
      *puVar26 = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      puVar26 = puVar26 + 1;
    } while (puVar26 < puStack_80);
  }
  puVar15 = puStack_118;
  if (uStack_134 < 0x41) {
    bVar14 = -cVar10 & 0x3f;
    do {
      if (puStack_118 < puStack_50) {
        puVar15 = puVar22;
        if (puStack_118 == puVar22) break;
        bVar32 = puVar22 <= (ulong *)((long)puStack_118 - (ulong)(uStack_134 >> 3));
        uVar11 = (int)puStack_118 - (int)puVar22;
        if (bVar32) {
          uVar11 = uStack_134 >> 3;
        }
        uStack_134 = uStack_134 + uVar11 * -8;
      }
      else {
        uVar11 = uStack_134 >> 3;
        uStack_134 = uStack_134 & 7;
        bVar32 = true;
      }
      puStack_118 = (ulong *)((long)puStack_118 - (ulong)uVar11);
      uStack_128 = *puStack_118;
      puVar15 = puStack_118;
      if ((puVar1 + -3 <= puVar20) || (!bVar32)) break;
      if (cVar10 == '\0') goto LAB_001644cd;
      uVar12 = (uStack_128 << ((byte)uStack_134 & 0x3f)) >> bVar14;
      iVar16 = *(byte *)((long)DTable + uVar12 * 2 + 5) + uStack_134;
      *puVar20 = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      uVar19 = (uStack_128 << ((byte)iVar16 & 0x3f)) >> bVar14;
      iVar16 = (uint)*(byte *)((long)DTable + uVar19 * 2 + 5) + iVar16;
      uVar12 = (uStack_128 << ((byte)iVar16 & 0x3f)) >> bVar14;
      puVar20[1] = *(undefined1 *)((long)pHVar29 + uVar19 * 2);
      iVar16 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 5) + iVar16;
      uVar19 = (uStack_128 << ((byte)iVar16 & 0x3f)) >> bVar14;
      puVar20[2] = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      uStack_134 = (uint)*(byte *)((long)DTable + uVar19 * 2 + 5) + iVar16;
      puVar20[3] = *(undefined1 *)((long)pHVar29 + uVar19 * 2);
      puVar20 = puVar20 + 4;
      if (0x40 < uStack_134) break;
    } while( true );
  }
  puStack_118 = puVar15;
  if (puVar20 < puVar1) {
    if (cVar10 == '\0') goto LAB_001644cd;
    do {
      uVar12 = (uStack_128 << ((byte)uStack_134 & 0x3f)) >> (-cVar10 & 0x3fU);
      uStack_134 = *(byte *)((long)DTable + uVar12 * 2 + 5) + uStack_134;
      *puVar20 = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      puVar20 = puVar20 + 1;
    } while (puVar20 < puVar1);
  }
  if (BStack_b0.bitsConsumed < 0x41) {
    bVar14 = -cVar10 & 0x3f;
    do {
      if (BStack_b0.ptr < BStack_b0.limitPtr) {
        if (BStack_b0.ptr == BStack_b0.start) break;
        bVar32 = BStack_b0.start <=
                 (size_t *)((long)BStack_b0.ptr - (ulong)(BStack_b0.bitsConsumed >> 3));
        uVar12 = (ulong)(uint)((int)BStack_b0.ptr - (int)BStack_b0.start);
        if (bVar32) {
          uVar12 = (ulong)(BStack_b0.bitsConsumed >> 3);
        }
        BStack_b0.bitsConsumed = BStack_b0.bitsConsumed + (int)uVar12 * -8;
      }
      else {
        uVar12 = (ulong)(BStack_b0.bitsConsumed >> 3);
        BStack_b0.bitsConsumed = BStack_b0.bitsConsumed & 7;
        bVar32 = true;
      }
      BStack_b0.ptr = (char *)((long)BStack_b0.ptr - uVar12);
      BStack_b0.bitContainer = *(size_t *)BStack_b0.ptr;
      if ((puStack_58 <= puStack_110) || (!bVar32)) break;
      if (cVar10 == '\0') goto LAB_001644cd;
      uVar12 = (BStack_b0.bitContainer << ((byte)BStack_b0.bitsConsumed & 0x3f)) >> bVar14;
      iVar16 = *(byte *)((long)DTable + uVar12 * 2 + 5) + BStack_b0.bitsConsumed;
      *puStack_110 = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      uVar12 = (BStack_b0.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar14;
      iVar16 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 5) + iVar16;
      puStack_110[1] = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      uVar12 = (BStack_b0.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar14;
      iVar16 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 5) + iVar16;
      puStack_110[2] = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      uVar12 = (BStack_b0.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar14;
      BStack_b0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar12 * 2 + 5) + iVar16;
      puStack_110[3] = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      puStack_110 = puStack_110 + 4;
      if (0x40 < BStack_b0.bitsConsumed) break;
    } while( true );
  }
  if (puStack_110 < (undefined1 *)((long)dst + maxDstSize)) {
    if (cVar10 == '\0') {
LAB_001644cd:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x680,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    do {
      uVar12 = (BStack_b0.bitContainer << ((byte)BStack_b0.bitsConsumed & 0x3f)) >>
               (-cVar10 & 0x3fU);
      BStack_b0.bitsConsumed = *(byte *)((long)DTable + uVar12 * 2 + 5) + BStack_b0.bitsConsumed;
      *puStack_110 = *(undefined1 *)((long)pHVar29 + uVar12 * 2);
      puStack_110 = puStack_110 + 1;
    } while (puStack_110 < (undefined1 *)((long)dst + maxDstSize));
  }
  if (BStack_b0.bitsConsumed != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (BStack_b0.ptr != BStack_b0.start) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uStack_134 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_118 != puVar22) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uStack_130 != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_e0 != puVar30) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (uStack_12c != 0x40) {
    maxDstSize = 0xffffffffffffffec;
  }
  if (puStack_100 != puStack_78) {
    return 0xffffffffffffffec;
  }
  return maxDstSize;
}

Assistant:

size_t HUF_decompress4X_usingDTable_bmi2(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int bmi2)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#endif
}